

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

QMimeData * __thiscall QTableModel::mimeData(QTableModel *this,QModelIndexList *indexes)

{
  int iVar1;
  qsizetype qVar2;
  QTableWidget *pQVar3;
  QList<QModelIndex> *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  QMimeData *mimeData;
  QTableWidget *view;
  int i;
  int indexesCount;
  QList<QTableWidgetItem_*> items;
  parameter_type in_stack_ffffffffffffff98;
  QList<QModelIndex> *in_stack_ffffffffffffffa0;
  QMimeData *local_58;
  QTableModel *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar4;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QTableWidgetItem_*>::QList((QList<QTableWidgetItem_*> *)0x8d8018);
  qVar2 = QList<QModelIndex>::size(in_RSI);
  iVar1 = (int)qVar2;
  QList<QTableWidgetItem_*>::reserve
            ((QList<QTableWidgetItem_*> *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
             in_stack_00000008);
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    QList<QModelIndex>::at(in_stack_ffffffffffffffa0,(qsizetype)in_stack_ffffffffffffff98);
    item(in_stack_ffffffffffffffb8,in_RDI);
    QList<QTableWidgetItem_*>::operator<<
              ((QList<QTableWidgetItem_*> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  pQVar3 = QTableModel::view((QTableModel *)0x8d8087);
  QList<QModelIndex>::operator=
            (in_stack_ffffffffffffffa0,(QList<QModelIndex> *)in_stack_ffffffffffffff98);
  if (pQVar3 == (QTableWidget *)0x0) {
    local_58 = (QMimeData *)0x0;
  }
  else {
    local_58 = (QMimeData *)
               (**(code **)(*(long *)&(pQVar3->super_QTableView).super_QAbstractItemView.
                                      super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x308))
                         (pQVar3,&local_20);
  }
  QList<QModelIndex>::clear(in_stack_ffffffffffffffa0);
  QList<QTableWidgetItem_*>::~QList((QList<QTableWidgetItem_*> *)0x8d80f6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_58;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QTableModel::mimeData(const QModelIndexList &indexes) const
{
    QList<QTableWidgetItem*> items;
    const int indexesCount = indexes.size();
    items.reserve(indexesCount);
    for (int i = 0; i < indexesCount; ++i)
        items << item(indexes.at(i));
    const QTableWidget *view = this->view();

    // cachedIndexes is a little hack to avoid copying from QModelIndexList to
    // QList<QTreeWidgetItem*> and back again in the view
    cachedIndexes = indexes;
    QMimeData *mimeData = (view ? view->mimeData(items) : nullptr);
    cachedIndexes.clear();
    return mimeData;
}